

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::computeLeaveCoPrhs(SPxSolverBase<double> *this)

{
  int iVar1;
  uint i;
  SPxId l_id;
  DataKey local_40;
  DataKey local_38;
  
  i = (this->thecovectors->set).thenum;
  while (0 < (int)i) {
    i = i - 1;
    local_40 = (this->super_SPxBasisBase<double>).theBaseId.data[i].super_DataKey;
    if (local_40.info < 0) {
      SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_40);
      iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                        (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                          super_SVSetBase<double>.set,&local_38);
      computeLeaveCoPrhs4Row(this,i,iVar1);
    }
    else {
      SPxColId::SPxColId((SPxColId *)&local_38,(SPxId *)&local_40);
      iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                        (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                          super_SVSetBase<double>.set,&local_38);
      computeLeaveCoPrhs4Col(this,i,iVar1);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeLeaveCoPrhs()
{
   assert(type() == LEAVE);

   for(int i = dim() - 1; i >= 0; --i)
   {
      SPxId l_id = this->baseId(i);

      if(l_id.isSPxRowId())
         computeLeaveCoPrhs4Row(i, this->number(SPxRowId(l_id)));
      else
         computeLeaveCoPrhs4Col(i, this->number(SPxColId(l_id)));
   }
}